

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O0

void __thiscall
SuiteTimeRangeTests::TestisInSameRange_UseLocalTime::RunImpl(TestisInSameRange_UseLocalTime *this)

{
  TestResults *this_00;
  bool bVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestDetails local_e0;
  TimeRange local_c0 [8];
  TimeRange timeRange;
  undefined1 local_80 [8];
  UtcTimeStamp time2;
  UtcTimeStamp time1;
  undefined1 local_40 [8];
  LocalTimeOnly end;
  LocalTimeOnly start;
  TestisInSameRange_UseLocalTime *this_local;
  
  FIX::LocalTimeOnly::LocalTimeOnly((LocalTimeOnly *)&end.super_DateTime.m_time,0,0,0,0);
  FIX::LocalTimeOnly::LocalTimeOnly((LocalTimeOnly *)local_40,1,0,0,0);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&time2.super_DateTime.m_time,10,0,0,10,10,2000);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)local_80,0xb,0,0,10,10,2000);
  FIX::TimeRange::TimeRange
            (local_c0,(LocalTimeOnly *)&end.super_DateTime.m_time,(LocalTimeOnly *)local_40,1,1);
  bVar1 = FIX::TimeRange::isInSameRange
                    (local_c0,(UtcTimeStamp *)&time2.super_DateTime.m_time,(UtcTimeStamp *)local_80)
  ;
  bVar1 = UnitTest::Check<bool>(bVar1);
  if (!bVar1) {
    ppTVar2 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar2;
    ppTVar3 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_e0,*ppTVar3,0x104);
    UnitTest::TestResults::OnTestFailure(this_00,&local_e0,"timeRange.isInSameRange(time1, time2)");
  }
  FIX::TimeRange::~TimeRange(local_c0);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_80);
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&time2.super_DateTime.m_time);
  FIX::LocalTimeOnly::~LocalTimeOnly((LocalTimeOnly *)local_40);
  FIX::LocalTimeOnly::~LocalTimeOnly((LocalTimeOnly *)&end.super_DateTime.m_time);
  return;
}

Assistant:

TEST(isInSameRange_UseLocalTime)
{
  LocalTimeOnly start( 0, 0, 0 );
  LocalTimeOnly end( 1, 0, 0 );

  UtcTimeStamp time1 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  UtcTimeStamp time2 = UtcTimeStamp( 11, 0, 0, 10, 10, 2000 );
  TimeRange timeRange(start, end, 1, 1);

  CHECK( timeRange.isInSameRange(time1, time2) );

}